

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int __thiscall CNumber<30>::shortest(CNumber<30> *this,type *right)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = this->m_number;
  iVar2 = right->m_number;
  iVar4 = iVar1 - iVar2;
  if (iVar1 < iVar2) {
    uVar6 = (iVar2 - iVar1) % 0x1e;
    uVar3 = (iVar2 - iVar1) % 0x1e + 0x1e;
    if (uVar6 < 0xffffffe2) {
      uVar3 = uVar6;
    }
    uVar5 = iVar4 % 0x1e + 0x1e;
    if ((uint)(iVar4 % 0x1e) < 0xffffffe2) {
      uVar5 = iVar4 % 0x1e;
    }
    uVar6 = -uVar5;
    if ((int)uVar3 < (int)uVar5) {
      uVar6 = uVar3;
    }
  }
  else {
    uVar6 = iVar4 % 0x1e + 0x1e;
    if ((uint)(iVar4 % 0x1e) < 0xffffffe2) {
      uVar6 = iVar4 % 0x1e;
    }
    uVar5 = (iVar2 - iVar1) % 0x1e;
    uVar3 = (iVar2 - iVar1) % 0x1e + 0x1e;
    if (uVar5 < 0xffffffe2) {
      uVar3 = uVar5;
    }
    uVar5 = -uVar3;
    if ((int)uVar6 < (int)uVar3) {
      uVar5 = uVar6;
    }
    uVar6 = -uVar5;
  }
  return uVar6;
}

Assistant:

int shortest(const type& right) const
        {
            // 1, 20 mod 30
            // 20 - 1 = 19
            // 1 - 20 = -19 mod 30 = 11
            if (*this < right)
            {
                return shortest_helper(right);
            }
            return -right.shortest_helper(*this);
        }